

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::BindContext::BindColumn
          (BindResult *__return_storage_ptr__,BindContext *this,ColumnRefExpression *colref,
          idx_t depth)

{
  bool bVar1;
  string *psVar2;
  optional_ptr<duckdb::Binding,_true> oVar3;
  Binding *pBVar4;
  InternalException *this_00;
  optional_ptr<duckdb::Binding,_true> binding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ErrorData error;
  BindingAlias local_168;
  BindingAlias alias;
  ErrorData local_a8;
  
  bVar1 = ColumnRefExpression::IsQualified(colref);
  if (bVar1) {
    ErrorData::ErrorData(&error);
    BindingAlias::BindingAlias(&alias);
    GetBindingAlias(&local_168,colref);
    psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
    oVar3 = GetBinding(this,&local_168,psVar2,&error);
    binding.ptr = oVar3.ptr;
    BindingAlias::~BindingAlias(&local_168);
    if (oVar3.ptr == (Binding *)0x0) {
      ErrorData::ErrorData(&local_a8,&error);
      BindResult::BindResult(__return_storage_ptr__,&local_a8);
      ErrorData::~ErrorData(&local_a8);
    }
    else {
      pBVar4 = optional_ptr<duckdb::Binding,_true>::operator->(&binding);
      (*pBVar4->_vptr_Binding[3])(__return_storage_ptr__,pBVar4,colref,depth);
    }
    BindingAlias::~BindingAlias(&alias);
    ErrorData::~ErrorData(&error);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&error,"Could not bind alias \"%s\"!",(allocator *)&alias);
  psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  ::std::__cxx11::string::string((string *)&local_208,(string *)psVar2);
  InternalException::InternalException<std::__cxx11::string>(this_00,(string *)&error,&local_208);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult BindContext::BindColumn(ColumnRefExpression &colref, idx_t depth) {
	if (!colref.IsQualified()) {
		throw InternalException("Could not bind alias \"%s\"!", colref.GetColumnName());
	}

	ErrorData error;
	BindingAlias alias;
	auto binding = GetBinding(GetBindingAlias(colref), colref.GetColumnName(), error);
	if (!binding) {
		return BindResult(std::move(error));
	}
	return binding->Bind(colref, depth);
}